

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioSop.c
# Opt level: O0

Vec_Int_t * Mio_SopCoverAnd(Vec_Int_t *p,Vec_Int_t *q)

{
  int iVar1;
  int iVar2;
  uint x;
  uint uVar3;
  uint x_00;
  Vec_Int_t *p_00;
  undefined4 local_30;
  undefined4 local_2c;
  int k;
  int i;
  uint EntryQ;
  uint EntryP;
  Vec_Int_t *r;
  Vec_Int_t *q_local;
  Vec_Int_t *p_local;
  
  iVar1 = Vec_IntSize(p);
  iVar2 = Vec_IntSize(q);
  p_00 = Vec_IntAlloc(iVar1 * iVar2);
  for (local_2c = 0; iVar1 = Vec_IntSize(p), local_2c < iVar1; local_2c = local_2c + 1) {
    x = Vec_IntEntry(p,local_2c);
    for (local_30 = 0; iVar1 = Vec_IntSize(q), local_30 < iVar1; local_30 = local_30 + 1) {
      uVar3 = Vec_IntEntry(q,local_30);
      x_00 = Mio_CubeAnd(x,uVar3);
      iVar1 = Mio_CubeEmpty(x_00);
      if (iVar1 == 0) {
        uVar3 = Mio_CubeAnd(x,uVar3);
        Mio_SopPushSCC(p_00,uVar3);
      }
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Mio_SopCoverAnd( Vec_Int_t * p, Vec_Int_t * q )
{
    Vec_Int_t * r;
    unsigned EntryP, EntryQ;
    int i, k;
    r = Vec_IntAlloc( Vec_IntSize(p) * Vec_IntSize(q) );
    Vec_IntForEachEntry( p, EntryP, i )
        Vec_IntForEachEntry( q, EntryQ, k )
            if ( !Mio_CubeEmpty( Mio_CubeAnd(EntryP, EntryQ) ) )
                Mio_SopPushSCC( r, Mio_CubeAnd(EntryP, EntryQ) );
    return r;
}